

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort uVar1;
  stbi__uint16 sVar2;
  uint uVar3;
  stbi__uint16 *psVar4;
  int iVar5;
  uint uVar6;
  ushort *puVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ushort *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  
  psVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/src/../include/stb_image.h"
                    ,0x6dd,
                    "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                   );
    }
    psVar4 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar4 == (stbi__uint16 *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
      psVar4 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar3 = req_comp + img_n * 8;
        if ((0x23 < uVar3) || ((0xe161a1c00U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pranjalpokharel7[P]our-rocket/src/../include/stb_image.h"
                        ,0x6fa,
                        "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                       );
        }
        iVar8 = x - 1;
        uVar9 = 1;
        if (1 < (int)y) {
          uVar9 = (ulong)y;
        }
        uVar12 = 0;
        uVar13 = 0;
        uVar14 = 0;
        do {
          iVar5 = (int)uVar14 * x;
          puVar11 = data + (uint)(iVar5 * img_n);
          puVar7 = psVar4 + (uint)(iVar5 * req_comp);
          switch(uVar3) {
          case 10:
            if (-1 < iVar8) {
              lVar10 = 0;
              uVar6 = x;
              do {
                psVar4[uVar13 + lVar10] = *(stbi__uint16 *)((long)data + lVar10 + uVar12 * 2);
                psVar4[uVar13 + lVar10 + 1] = 0xffff;
                uVar6 = uVar6 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar6);
            }
            break;
          case 0xb:
            if (-1 < iVar8) {
              puVar7 = psVar4 + uVar13 + 2;
              uVar6 = x;
              do {
                uVar1 = *puVar11;
                *puVar7 = uVar1;
                puVar7[-1] = uVar1;
                puVar7[-2] = uVar1;
                puVar11 = puVar11 + 1;
                uVar6 = uVar6 - 1;
                puVar7 = puVar7 + 3;
              } while (0 < (int)uVar6);
            }
            break;
          case 0xc:
            if (-1 < iVar8) {
              lVar10 = 0;
              uVar6 = x;
              do {
                sVar2 = *(stbi__uint16 *)((long)data + lVar10 + uVar12 * 2);
                psVar4[uVar13 + lVar10 * 2 + 2] = sVar2;
                psVar4[uVar13 + lVar10 * 2 + 1] = sVar2;
                psVar4[uVar13 + lVar10 * 2] = sVar2;
                psVar4[uVar13 + lVar10 * 2 + 3] = 0xffff;
                uVar6 = uVar6 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar6);
            }
            break;
          default:
            uVar6 = x;
            if (-1 < iVar8) {
              do {
                *puVar7 = *puVar11;
                puVar7[1] = puVar11[1];
                puVar7[2] = puVar11[2];
                puVar11 = puVar11 + 4;
                puVar7 = puVar7 + 3;
                uVar6 = uVar6 - 1;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x11:
            if (-1 < iVar8) {
              lVar10 = 0;
              uVar6 = x;
              do {
                *(stbi__uint16 *)((long)psVar4 + lVar10 + uVar13 * 2) = data[uVar12 + lVar10];
                uVar6 = uVar6 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x13:
            if (-1 < iVar8) {
              puVar7 = psVar4 + uVar13 + 2;
              uVar6 = x;
              do {
                uVar1 = *puVar11;
                *puVar7 = uVar1;
                puVar7[-1] = uVar1;
                puVar7[-2] = uVar1;
                puVar11 = puVar11 + 2;
                uVar6 = uVar6 - 1;
                puVar7 = puVar7 + 3;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x14:
            if (-1 < iVar8) {
              lVar10 = 0;
              uVar6 = x;
              do {
                sVar2 = *(stbi__uint16 *)((long)data + lVar10 + uVar12 * 2);
                psVar4[uVar13 + lVar10 + 2] = sVar2;
                psVar4[uVar13 + lVar10 + 1] = sVar2;
                psVar4[uVar13 + lVar10] = sVar2;
                psVar4[uVar13 + lVar10 + 3] =
                     *(stbi__uint16 *)((long)data + lVar10 + uVar12 * 2 + 2);
                uVar6 = uVar6 - 1;
                lVar10 = lVar10 + 4;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x19:
            uVar6 = x;
            if (-1 < iVar8) {
              do {
                uVar1 = puVar11[2];
                *puVar7 = (ushort)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                                   (uint)puVar11[1] * 0x96 + (uint)*puVar11 * 0x4d >> 8);
                puVar11 = puVar11 + 3;
                puVar7 = puVar7 + 1;
                uVar6 = uVar6 - 1;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x1a:
            uVar6 = x;
            if (-1 < iVar8) {
              do {
                uVar1 = puVar11[2];
                *puVar7 = (ushort)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                                   (uint)puVar11[1] * 0x96 + (uint)*puVar11 * 0x4d >> 8);
                puVar7[1] = 0xffff;
                puVar11 = puVar11 + 3;
                puVar7 = puVar7 + 2;
                uVar6 = uVar6 - 1;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x1c:
            uVar6 = x;
            if (-1 < iVar8) {
              do {
                *puVar7 = *puVar11;
                puVar7[1] = puVar11[1];
                puVar7[2] = puVar11[2];
                puVar7[3] = 0xffff;
                puVar11 = puVar11 + 3;
                puVar7 = puVar7 + 4;
                uVar6 = uVar6 - 1;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x21:
            if (-1 < iVar8) {
              lVar10 = 0;
              uVar6 = x;
              do {
                uVar1 = data[uVar12 + lVar10 * 2 + 2];
                *(short *)((long)psVar4 + lVar10 + uVar13 * 2) =
                     (short)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                             (uint)data[uVar12 + lVar10 * 2 + 1] * 0x96 +
                             (uint)data[uVar12 + lVar10 * 2] * 0x4d >> 8);
                uVar6 = uVar6 - 1;
                lVar10 = lVar10 + 2;
              } while (0 < (int)uVar6);
            }
            break;
          case 0x22:
            if (-1 < iVar8) {
              lVar10 = 0;
              uVar6 = x;
              do {
                uVar1 = data[uVar12 + lVar10 + 2];
                *(short *)((long)psVar4 + lVar10 + uVar13 * 2) =
                     (short)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                             (uint)data[uVar12 + lVar10 + 1] * 0x96 +
                             (uint)data[uVar12 + lVar10] * 0x4d >> 8);
                *(stbi__uint16 *)((long)psVar4 + lVar10 + uVar13 * 2 + 2) =
                     data[uVar12 + lVar10 + 3];
                uVar6 = uVar6 - 1;
                lVar10 = lVar10 + 4;
              } while (0 < (int)uVar6);
            }
          }
          uVar14 = uVar14 + 1;
          uVar13 = (ulong)((int)uVar13 + req_comp * x);
          uVar12 = (ulong)((int)uVar12 + x * img_n);
        } while (uVar14 != uVar9);
      }
      free(data);
    }
  }
  return psVar4;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return (stbi__uint16*) stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}